

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall
ncnn::Net::forward_layer
          (Net *this,int layer_index,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats,
          Option *opt)

{
  Layer *pLVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Option *pOVar7;
  Option *pOVar8;
  pointer pMVar9;
  void *in_R8;
  size_t i;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  Mat bottom_blob;
  Mat top_blob;
  allocator_type local_c1;
  Net *local_c0;
  Mat local_b8;
  Mat local_78;
  
  pLVar1 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
           super__Vector_impl_data._M_start[layer_index];
  local_c0 = this;
  if (pLVar1->one_blob_only == true) {
    pOVar8 = *(Option **)
              &(pLVar1->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data;
    iVar3 = *(pLVar1->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar6 = *(int *)pOVar8;
    pMVar9 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pMVar9[iVar3].dims == 0) {
      pOVar8 = opt;
      iVar5 = forward_layer(this,(this->blobs).
                                 super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl
                                 .super__Vector_impl_data._M_start[iVar3].producer,blob_mats,opt);
      if (iVar5 != 0) {
        return iVar5;
      }
      pMVar9 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    iVar5 = (int)pOVar8;
    Mat::Mat(&local_b8,pMVar9 + iVar3);
    if (((opt->lightmode == true) &&
        (Mat::release((blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start + iVar3), pLVar1->support_inplace == true))
       && (*local_b8.refcount != 1)) {
      Mat::clone(&local_78,(__fn *)&local_b8,(void *)0x0,iVar5,in_R8);
      Mat::operator=(&local_b8,&local_78);
      Mat::~Mat(&local_78);
    }
    if ((opt->lightmode == true) && (pLVar1->support_inplace == true)) {
      iVar3 = (*pLVar1->_vptr_Layer[9])(pLVar1,&local_b8,opt);
      if (iVar3 == 0) {
        iVar3 = 0;
        bVar12 = true;
        Mat::operator=((blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start + iVar6,&local_b8);
      }
      else {
        bVar12 = false;
      }
    }
    else {
      local_78.elemsize._0_4_ = 0;
      local_78._20_8_ = 0;
      local_78.data = (void *)0x0;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.allocator = (Allocator *)0x0;
      local_78.dims = 0;
      local_78.w = 0;
      local_78.h = 0;
      local_78.c = 0;
      local_78.cstep = 0;
      iVar3 = (*pLVar1->_vptr_Layer[7])(pLVar1,&local_b8,&local_78,opt);
      bVar12 = iVar3 == 0;
      if (bVar12) {
        Mat::operator=((blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start + iVar6,&local_78);
      }
      Mat::~Mat(&local_78);
    }
    Mat::~Mat(&local_b8);
    goto joined_r0x0011d486;
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_78,
             (long)(pLVar1->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             *(long *)&(pLVar1->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data >> 2,(allocator_type *)&local_b8);
  lVar11 = 0;
  pOVar8 = (Option *)0x0;
  while( true ) {
    lVar2 = *(long *)&(pLVar1->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    pOVar7 = (Option *)
             ((long)(pLVar1->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - lVar2 >> 2);
    if (pOVar7 <= pOVar8) break;
    iVar3 = *(int *)(lVar2 + (long)pOVar8 * 4);
    pMVar9 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pMVar9[iVar3].dims == 0) {
      pOVar7 = opt;
      uVar4 = forward_layer(local_c0,(local_c0->blobs).
                                     super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                     _M_impl.super__Vector_impl_data._M_start[iVar3].producer,
                            blob_mats,opt);
      if (uVar4 != 0) goto LAB_0011d3a0;
      pMVar9 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    iVar6 = (int)pOVar7;
    Mat::operator=((Mat *)((long)local_78.data + lVar11),pMVar9 + iVar3);
    if (((opt->lightmode == true) &&
        (Mat::release((blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start + iVar3), pLVar1->support_inplace == true))
       && (**(int **)((long)local_78.data + lVar11 + 8) != 1)) {
      Mat::clone(&local_b8,(__fn *)((long)local_78.data + lVar11),(void *)0x0,iVar6,in_R8);
      Mat::operator=((Mat *)((long)local_78.data + lVar11),&local_b8);
      Mat::~Mat(&local_b8);
    }
    pOVar8 = (Option *)&pOVar8->field_0x1;
    lVar11 = lVar11 + 0x40;
  }
  if ((opt->lightmode == true) && (pLVar1->support_inplace == true)) {
    uVar4 = (*pLVar1->_vptr_Layer[8])(pLVar1,&local_78,opt);
    if (uVar4 == 0) {
      lVar11 = 0;
      for (uVar10 = 0;
          lVar2 = *(long *)&(pLVar1->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data,
          uVar10 < (ulong)((long)(pLVar1->tops).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - lVar2 >> 2);
          uVar10 = uVar10 + 1) {
        Mat::operator=((blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start + *(int *)(lVar2 + uVar10 * 4),
                       (Mat *)((long)local_78.data + lVar11));
        lVar11 = lVar11 + 0x40;
      }
      bVar12 = true;
    }
    else {
LAB_0011d3a0:
      blob_mats = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(ulong)uVar4;
      bVar12 = false;
    }
  }
  else {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_b8,
               (long)(pLVar1->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               *(long *)&(pLVar1->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data >> 2,&local_c1);
    uVar4 = (*pLVar1->_vptr_Layer[6])(pLVar1,&local_78,&local_b8,opt);
    if (uVar4 != 0) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_b8);
      goto LAB_0011d3a0;
    }
    lVar11 = 0;
    for (uVar10 = 0;
        lVar2 = *(long *)&(pLVar1->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data,
        uVar10 < (ulong)((long)(pLVar1->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - lVar2 >> 2); uVar10 = uVar10 + 1)
    {
      Mat::operator=((blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_start + *(int *)(lVar2 + uVar10 * 4),
                     (Mat *)((long)local_b8.data + lVar11));
      lVar11 = lVar11 + 0x40;
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_b8);
    blob_mats = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x0;
    bVar12 = true;
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_78);
  iVar3 = (int)blob_mats;
joined_r0x0011d486:
  if (bVar12) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int Net::forward_layer(int layer_index, std::vector<Mat>& blob_mats, Option& opt) const
{
    const Layer* layer = layers[layer_index];

//     fprintf(stderr, "forward_layer %d %s\n", layer_index, layer->name.c_str());

    if (layer->one_blob_only)
    {
        // load bottom blob
        int bottom_blob_index = layer->bottoms[0];
        int top_blob_index = layer->tops[0];

        if (blob_mats[bottom_blob_index].dims == 0)
        {
            int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
            if (ret != 0)
                return ret;
        }

        Mat bottom_blob = blob_mats[bottom_blob_index];

        if (opt.lightmode)
        {
            // delete after taken in light mode
            blob_mats[bottom_blob_index].release();
            // deep copy for inplace forward if data is shared
            if (layer->support_inplace && *bottom_blob.refcount != 1)
            {
                bottom_blob = bottom_blob.clone();
            }
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            Mat& bottom_top_blob = bottom_blob;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward_inplace(bottom_top_blob, opt);
            double end = get_current_time();
            benchmark(layer, bottom_top_blob, bottom_top_blob, start, end);
#else
            int ret = layer->forward_inplace(bottom_top_blob, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = bottom_top_blob;
        }
        else
        {
            Mat top_blob;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward(bottom_blob, top_blob, opt);
            double end = get_current_time();
            benchmark(layer, bottom_blob, top_blob, start, end);
#else
            int ret = layer->forward(bottom_blob, top_blob, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = top_blob;
        }

    }
    else
    {
        // load bottom blobs
        std::vector<Mat> bottom_blobs(layer->bottoms.size());
        for (size_t i=0; i<layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            if (blob_mats[bottom_blob_index].dims == 0)
            {
                int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
                if (ret != 0)
                    return ret;
            }

            bottom_blobs[i] = blob_mats[bottom_blob_index];

            if (opt.lightmode)
            {
                // delete after taken in light mode
                blob_mats[bottom_blob_index].release();
                // deep copy for inplace forward if data is shared
                if (layer->support_inplace && *bottom_blobs[i].refcount != 1)
                {
                    bottom_blobs[i] = bottom_blobs[i].clone();
                }
            }
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            std::vector<Mat>& bottom_top_blobs = bottom_blobs;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
            double end = get_current_time();
            benchmark(layer, start, end);
#else
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i=0; i<layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = bottom_top_blobs[i];
            }
        }
        else
        {
            std::vector<Mat> top_blobs(layer->tops.size());
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
            double end = get_current_time();
            benchmark(layer, start, end);
#else
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i=0; i<layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = top_blobs[i];
            }
        }
    }

//     fprintf(stderr, "forward_layer %d %s done\n", layer_index, layer->name.c_str());
//     const Mat& blob = blob_mats[layer->tops[0]];
//     fprintf(stderr, "[%-2d %-16s %-16s]  %d    blobs count = %-3d   size = %-3d x %-3d\n", layer_index, layer->type.c_str(), layer->name.c_str(), layer->tops[0], blob.c, blob.h, blob.w);

    return 0;
}